

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

optional<pbrt::LightLiSample> * __thiscall
pbrt::UniformInfiniteLight::SampleLi
          (optional<pbrt::LightLiSample> *__return_storage_ptr__,UniformInfiniteLight *this,
          LightSampleContext ctx,Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  float fVar4;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  SampledSpectrum SVar17;
  undefined1 auVar11 [56];
  undefined1 auVar14 [56];
  
  auVar9._8_56_ = in_register_00001208;
  auVar9._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  if (mode == WithMIS) {
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  else {
    auVar5 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar9._0_16_,
                             SUB6416(ZEXT464(0x3f800000),0));
    auVar8 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar5,auVar5);
    auVar8 = vmaxss_avx(auVar8,ZEXT816(0) << 0x20);
    auVar12 = vsqrtss_avx(auVar8,auVar8);
    auVar14 = ZEXT856(auVar12._8_8_);
    auVar8 = vmovshdup_avx(auVar9._0_16_);
    fVar4 = auVar8._0_4_ * 6.2831855;
    fVar6 = cosf(fVar4);
    fVar6 = fVar6 * auVar12._0_4_;
    fVar7 = sinf(fVar4);
    fVar4 = this->scale;
    auVar8._4_4_ = fVar4;
    auVar8._0_4_ = fVar4;
    auVar8._8_4_ = fVar4;
    auVar8._12_4_ = fVar4;
    auVar11 = ZEXT856(auVar8._8_8_);
    SVar17 = DenselySampledSpectrum::Sample(&this->Lemit,&lambda);
    auVar13._0_8_ = SVar17.values.values._8_8_;
    auVar13._8_56_ = auVar14;
    auVar10._0_8_ = SVar17.values.values._0_8_;
    auVar10._8_56_ = auVar11;
    auVar3 = vmovlhps_avx(auVar10._0_16_,auVar13._0_16_);
    fVar7 = fVar7 * auVar12._0_4_;
    fVar1 = this->sceneRadius;
    auVar8 = vinsertps_avx(ZEXT416((uint)fVar6),ZEXT416((uint)fVar7),0x10);
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    fVar1 = fVar1 + fVar1;
    fVar7 = (ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
            ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high) *
            0.5 + fVar7 * fVar1;
    fVar6 = (ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low +
            ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high) *
            0.5 + fVar6 * fVar1;
    fVar1 = (ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
            ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) *
            0.5 + auVar5._0_4_ * fVar1;
    auVar15._4_4_ = fVar6;
    auVar15._0_4_ = fVar6;
    auVar15._8_4_ = fVar6;
    auVar15._12_4_ = fVar6;
    auVar12._4_4_ = fVar7;
    auVar12._0_4_ = fVar7;
    auVar12._8_4_ = fVar7;
    auVar12._12_4_ = fVar7;
    auVar16._4_4_ = fVar1;
    auVar16._0_4_ = fVar1;
    auVar16._8_4_ = fVar1;
    auVar16._12_4_ = fVar1;
    *(undefined1 (*) [32])((long)&__return_storage_ptr__->optionalValue + 0x38) =
         ZEXT1232(ZEXT812(0));
    __return_storage_ptr__->set = true;
    *(float *)&__return_storage_ptr__->optionalValue = auVar3._0_4_ * fVar4;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 4) = auVar3._4_4_ * fVar4;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 8) = auVar3._8_4_ * fVar4;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0xc) = auVar3._12_4_ * fVar4;
    uVar2 = vmovlps_avx(auVar8);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar2;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = auVar5._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0x3da2f983;
    auVar8 = vmovlhps_avx(auVar15,auVar12);
    *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x20) = auVar8;
    uVar2 = vmovlps_avx(auVar16);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uVar2;
    *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x60) =
         &(this->super_LightBase).mediumInterface;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLiSample> UniformInfiniteLight::SampleLi(
    LightSampleContext ctx, Point2f u, SampledWavelengths lambda,
    LightSamplingMode mode) const {
    if (mode == LightSamplingMode::WithMIS)
        return {};
    // Return uniform spherical sample for uniform infinite light
    Vector3f wi = SampleUniformSphere(u);
    Float pdf = UniformSpherePDF();
    return LightLiSample(scale * Lemit.Sample(lambda), wi, pdf,
                         Interaction(ctx.p() + wi * (2 * sceneRadius), &mediumInterface));
}